

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

InterpretResult interpret(Vm *vm,char *source)

{
  int iVar1;
  InterpretResult result;
  int compile_result;
  Compiler compiler;
  char *source_local;
  Vm *vm_local;
  
  compiler._4256_8_ = source;
  init_compiler((Compiler *)&result,source);
  memcpy(&vm->compiler,&result,0x10a8);
  iVar1 = compile(vm);
  if (iVar1 == 0) {
    (vm->frames).frame_pointers[vm->frame_count - 1]->ip =
         ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).code;
    vm->current_status = VM_STATUS_RUNNING;
    vm_local._4_4_ = run(vm);
    free_compiler(&vm->compiler);
  }
  else {
    vm_local._4_4_ = INTERPRET_COMPILE_ERROR;
  }
  return vm_local._4_4_;
}

Assistant:

InterpretResult interpret(Vm *vm, const char *source) {
    Compiler compiler;
    init_compiler(&compiler, source);

    vm->compiler = compiler;
    int compile_result = compile(vm);

    if (compile_result) {
        return INTERPRET_COMPILE_ERROR;
    }

#if DEBUG_SHOW_DISASSEMBLY
    disassemble_curr_frame(vm, "Main Program");
#endif

    CURR_FRAME(vm)->ip = CURR_FRAME(vm)->code_buffer.code;
    vm->current_status = VM_STATUS_RUNNING;
    InterpretResult result = run(vm);
    free_compiler(&vm->compiler);

    return result;
}